

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O3

int event_process_active_single_queue
              (event_base *base,evcallback_list *activeq,int max_to_process,timeval *endtime)

{
  uint8_t uVar1;
  ushort uVar2;
  event *ev;
  _func_void_int_short_void_ptr *p_Var3;
  ulong uVar4;
  long lVar5;
  short sVar6;
  uint uVar7;
  char *pcVar8;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  char *pcVar9;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  void *pvVar10;
  void *extraout_RDX_05;
  void *extraout_RDX_06;
  long lVar11;
  int iVar12;
  event *ev_00;
  uint uVar13;
  short *psVar14;
  char *pcVar15;
  int iVar16;
  timeval *ptVar17;
  bool bVar18;
  timeval now;
  timeval local_68;
  timeval local_58;
  int local_44;
  timeval *local_40;
  evcallback_list *local_38;
  
  local_44 = max_to_process;
  local_38 = activeq;
  if (activeq != (evcallback_list *)0x0) {
    local_40 = &base->tv_cache;
    iVar16 = 0;
    do {
      ev = (event *)local_38->tqh_first;
      if (ev == (event *)0x0) {
        return iVar16;
      }
      uVar2 = (ev->ev_evcallback).evcb_flags;
      if ((char)uVar2 < '\0') {
        if ((uVar2 & 0x40) == 0 && (ev->ev_events & 0x10U) == 0) {
          event_del_nolock_(ev,0);
          pvVar10 = extraout_RDX_02;
        }
        else {
          event_queue_remove_active(base,(event_callback *)ev);
          pvVar10 = extraout_RDX_01;
        }
        ev_00 = ev;
        if (event_debug_logging_mask_ != 0) {
          uVar2 = ev->ev_res;
          pcVar9 = "EV_READ ";
          if ((uVar2 & 2) == 0) {
            pcVar9 = " ";
          }
          pcVar8 = "EV_WRITE ";
          if ((uVar2 & 4) == 0) {
            pcVar8 = " ";
          }
          pcVar15 = "EV_CLOSED ";
          if (-1 < (char)uVar2) {
            pcVar15 = " ";
          }
          event_debugx_("event_process_active: event: %p, %s%s%scall %p",ev,pcVar9,pcVar8,pcVar15,
                        (ev->ev_evcallback).evcb_cb_union.evcb_callback);
          pvVar10 = extraout_RDX_03;
        }
      }
      else {
        event_queue_remove_active(base,(event_callback *)ev);
        pvVar10 = extraout_RDX;
        if (event_debug_logging_mask_ != 0) {
          event_debugx_("event_process_active: event_callback %p, closure %d, call %p",ev,
                        (ulong)(ev->ev_evcallback).evcb_closure,
                        (ev->ev_evcallback).evcb_cb_union.evcb_callback);
          pvVar10 = extraout_RDX_00;
        }
        ev_00 = (event *)0x0;
      }
      iVar16 = iVar16 + (uint)(((ev->ev_evcallback).evcb_flags & 0x10U) == 0);
      base->current_event = (event_callback *)ev;
      base->current_event_waiters = 0;
      uVar1 = (ev->ev_evcallback).evcb_closure;
      switch(uVar1) {
      case '\0':
        if (ev_00 == (event *)0x0) goto LAB_0022f121;
        p_Var3 = (ev_00->ev_evcallback).evcb_cb_union.evcb_callback;
        sVar6 = ev_00->ev_res;
        if (base->th_base_lock != (void *)0x0) {
          (*evthread_lock_fns_.unlock)(0,base->th_base_lock);
        }
        (*p_Var3)(ev_00->ev_fd,sVar6,(ev_00->ev_evcallback).evcb_arg);
        break;
      case '\x01':
        if (ev_00 == (event *)0x0) goto LAB_0022f126;
        sVar6 = (ev_00->ev_).ev_signal.ev_ncalls;
        local_68.tv_sec = CONCAT62(local_68.tv_sec._2_6_,sVar6);
        if (sVar6 != 0) {
          (ev_00->ev_).ev_signal.ev_pncalls = (short *)&local_68;
        }
        if (base->th_base_lock != (void *)0x0) {
          (*evthread_lock_fns_.unlock)(0,base->th_base_lock);
        }
        do {
          if ((short)local_68.tv_sec == 0) goto LAB_0022f033;
          sVar6 = (short)local_68.tv_sec + -1;
          local_68.tv_sec = CONCAT62(local_68.tv_sec._2_6_,sVar6);
          (ev_00->ev_).ev_signal.ev_ncalls = sVar6;
          if (sVar6 == 0) {
            (ev_00->ev_).ev_io.ev_timeout.tv_usec = 0;
          }
          (*(ev_00->ev_evcallback).evcb_cb_union.evcb_callback)
                    (ev_00->ev_fd,ev_00->ev_res,(ev_00->ev_evcallback).evcb_arg);
          if (base->th_base_lock == (void *)0x0) {
            iVar12 = base->event_break;
          }
          else {
            (*evthread_lock_fns_.lock)(0,base->th_base_lock);
            iVar12 = base->event_break;
            if (base->th_base_lock != (void *)0x0) {
              (*evthread_lock_fns_.unlock)(0,base->th_base_lock);
            }
          }
        } while (iVar12 == 0);
        if ((short)local_68.tv_sec != 0) {
          (ev_00->ev_).ev_io.ev_timeout.tv_usec = 0;
        }
        break;
      case '\x02':
        if (ev_00 == (event *)0x0) goto LAB_0022f11c;
        uVar4 = (ev_00->ev_).ev_io.ev_timeout.tv_usec;
        if ((ev_00->ev_).ev_io.ev_timeout.tv_sec != 0 || uVar4 != 0) {
          if (0xfffff < (uVar4 ^ (ev_00->ev_timeout).tv_usec)) goto LAB_0022f135;
          ptVar17 = &ev_00->ev_timeout;
          gettime(base,&local_58);
          local_68.tv_usec = (ev_00->ev_timeout).tv_usec;
          if ((((uint)local_68.tv_usec & 0xf0000000) == 0x50000000) &&
             ((int)((uint)((ulong)local_68.tv_usec >> 0x14) & 0xff) < base->n_common_timeouts)) {
            lVar11 = (ev_00->ev_).ev_io.ev_timeout.tv_sec;
            uVar13 = (uint)(ev_00->ev_).ev_io.ev_timeout.tv_usec;
            uVar7 = uVar13 & 0xfff00000;
            psVar14 = (short *)(ulong)(uVar13 & 0xfffff);
            if ((ev_00->ev_res & 1) == 0) {
              ptVar17 = &local_58;
              local_68.tv_usec = local_58.tv_usec;
            }
            else {
              local_68.tv_usec = (__suseconds_t)((uint)local_68.tv_usec & 0xfffff);
            }
          }
          else {
            bVar18 = (ev_00->ev_res & 1) == 0;
            lVar11 = (ev_00->ev_).ev_io.ev_timeout.tv_sec;
            if (bVar18) {
              local_68.tv_usec = local_58.tv_usec;
            }
            psVar14 = (ev_00->ev_).ev_signal.ev_pncalls;
            if (bVar18) {
              ptVar17 = &local_58;
            }
            uVar7 = 0;
          }
          local_68.tv_sec = ptVar17->tv_sec + lVar11;
          local_68.tv_usec = local_68.tv_usec + (long)psVar14;
          if (999999 < local_68.tv_usec) {
            local_68.tv_sec = local_68.tv_sec + 1;
            local_68.tv_usec = local_68.tv_usec - 1000000;
          }
          if (local_68.tv_sec == local_58.tv_sec) {
            if (local_68.tv_usec < local_58.tv_usec) {
LAB_0022efb4:
              local_68.tv_sec = local_58.tv_sec + lVar11;
              local_68.tv_usec = local_58.tv_usec + (long)psVar14;
              if (999999 < local_68.tv_usec) {
                local_68.tv_sec = local_68.tv_sec + 1;
                local_68.tv_usec = local_68.tv_usec - 1000000;
              }
            }
          }
          else if (local_68.tv_sec < local_58.tv_sec) goto LAB_0022efb4;
          local_68.tv_usec = (ulong)uVar7 | local_68.tv_usec;
          event_add_nolock_(ev_00,&local_68,1);
        }
        p_Var3 = (ev_00->ev_evcallback).evcb_cb_union.evcb_callback;
        pvVar10 = (ev_00->ev_evcallback).evcb_arg;
        iVar12 = ev_00->ev_fd;
        sVar6 = ev_00->ev_res;
        if (base->th_base_lock != (void *)0x0) {
          (*evthread_lock_fns_.unlock)(0,base->th_base_lock);
        }
        (*p_Var3)(iVar12,sVar6,pvVar10);
        break;
      case '\x03':
        p_Var3 = (ev->ev_evcallback).evcb_cb_union.evcb_callback;
        if (base->th_base_lock != (void *)0x0) {
          (*evthread_lock_fns_.unlock)(0,base->th_base_lock);
          pvVar10 = extraout_RDX_06;
        }
        (*p_Var3)((int)ev,(short)(ev->ev_evcallback).evcb_arg,pvVar10);
        break;
      case '\x04':
        p_Var3 = (ev->ev_evcallback).evcb_cb_union.evcb_callback;
        base->current_event = (event_callback *)0x0;
        if (((ev->ev_evcallback).evcb_flags & 0x40) == 0) goto LAB_0022f12b;
        if (base->th_base_lock != (void *)0x0) {
          (*evthread_lock_fns_.unlock)(0,base->th_base_lock);
          pvVar10 = extraout_RDX_05;
        }
        (*p_Var3)((int)ev,(short)(ev->ev_evcallback).evcb_arg,pvVar10);
        break;
      case '\x05':
      case '\x06':
        if (ev_00 == (event *)0x0) {
          event_process_active_single_queue_cold_3();
        }
        else {
          base->current_event = (event_callback *)0x0;
          if (((ev->ev_evcallback).evcb_flags & 0x40) != 0) {
            p_Var3 = (ev_00->ev_evcallback).evcb_cb_union.evcb_callback;
            if (base->th_base_lock != (void *)0x0) {
              (*evthread_lock_fns_.unlock)(0,base->th_base_lock);
              pvVar10 = extraout_RDX_04;
            }
            (*p_Var3)((int)ev_00,(short)(ev_00->ev_evcallback).evcb_arg,pvVar10);
            event_debug_note_teardown_(ev_00);
            if (uVar1 == '\x06') {
              if (mm_free_fn_ == (_func_void_void_ptr *)0x0) {
                free(ev_00);
              }
              else {
                (*mm_free_fn_)(ev_00);
              }
            }
            break;
          }
        }
        event_process_active_single_queue_cold_2();
LAB_0022f11c:
        event_process_active_single_queue_cold_6();
LAB_0022f121:
        event_process_active_single_queue_cold_4();
LAB_0022f126:
        event_process_active_single_queue_cold_7();
LAB_0022f12b:
        event_process_active_single_queue_cold_1();
        goto LAB_0022f130;
      default:
        goto switchD_0022ecc4_default;
      }
LAB_0022f033:
      if (base->th_base_lock != (void *)0x0) {
        (*evthread_lock_fns_.lock)(0,base->th_base_lock);
      }
      base->current_event = (event_callback *)0x0;
      if (base->current_event_waiters != 0) {
        base->current_event_waiters = 0;
        if (base->current_event_cond != (void *)0x0) {
          (*evthread_cond_fns_.signal_condition)(base->current_event_cond,1);
        }
      }
      if (base->event_break != 0) {
        return -1;
      }
      if (local_44 <= iVar16) {
        return iVar16;
      }
      if ((endtime != (timeval *)0x0) && (iVar16 != 0)) {
        (base->tv_cache).tv_sec = 0;
        if ((base->flags & EVENT_BASE_FLAG_NO_CACHE_TIME) == 0) {
          gettime(base,local_40);
        }
        gettime(base,&local_68);
        lVar11 = endtime->tv_sec;
        bVar18 = SBORROW8(local_68.tv_sec,lVar11);
        lVar5 = local_68.tv_sec - lVar11;
        if (local_68.tv_sec == lVar11) {
          bVar18 = SBORROW8(local_68.tv_usec,endtime->tv_usec);
          lVar5 = local_68.tv_usec - endtime->tv_usec;
        }
        if (bVar18 == lVar5 < 0) {
          return iVar16;
        }
      }
      if (base->event_continue != 0) {
        return iVar16;
      }
    } while( true );
  }
LAB_0022f130:
  event_process_active_single_queue_cold_8();
LAB_0022f135:
  event_process_active_single_queue_cold_5();
switchD_0022ecc4_default:
  event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/event.c"
             ,0x6c2,"0","event_process_active_single_queue");
}

Assistant:

static int
event_process_active_single_queue(struct event_base *base,
    struct evcallback_list *activeq,
    int max_to_process, const struct timeval *endtime)
{
	struct event_callback *evcb;
	int count = 0;

	EVUTIL_ASSERT(activeq != NULL);

	for (evcb = TAILQ_FIRST(activeq); evcb; evcb = TAILQ_FIRST(activeq)) {
		struct event *ev=NULL;
		if (evcb->evcb_flags & EVLIST_INIT) {
			ev = event_callback_to_event(evcb);

			if (ev->ev_events & EV_PERSIST || ev->ev_flags & EVLIST_FINALIZING)
				event_queue_remove_active(base, evcb);
			else
				event_del_nolock_(ev, EVENT_DEL_NOBLOCK);
			event_debug((
			    "event_process_active: event: %p, %s%s%scall %p",
			    ev,
			    ev->ev_res & EV_READ ? "EV_READ " : " ",
			    ev->ev_res & EV_WRITE ? "EV_WRITE " : " ",
			    ev->ev_res & EV_CLOSED ? "EV_CLOSED " : " ",
			    ev->ev_callback));
		} else {
			event_queue_remove_active(base, evcb);
			event_debug(("event_process_active: event_callback %p, "
				"closure %d, call %p",
				evcb, evcb->evcb_closure, evcb->evcb_cb_union.evcb_callback));
		}

		if (!(evcb->evcb_flags & EVLIST_INTERNAL))
			++count;


		base->current_event = evcb;
#ifndef EVENT__DISABLE_THREAD_SUPPORT
		base->current_event_waiters = 0;
#endif

		switch (evcb->evcb_closure) {
		case EV_CLOSURE_EVENT_SIGNAL:
			EVUTIL_ASSERT(ev != NULL);
			event_signal_closure(base, ev);
			break;
		case EV_CLOSURE_EVENT_PERSIST:
			EVUTIL_ASSERT(ev != NULL);
			event_persist_closure(base, ev);
			break;
		case EV_CLOSURE_EVENT: {
			void (*evcb_callback)(evutil_socket_t, short, void *);
			short res;
			EVUTIL_ASSERT(ev != NULL);
			evcb_callback = *ev->ev_callback;
			res = ev->ev_res;
			EVBASE_RELEASE_LOCK(base, th_base_lock);
			evcb_callback(ev->ev_fd, res, ev->ev_arg);
		}
		break;
		case EV_CLOSURE_CB_SELF: {
			void (*evcb_selfcb)(struct event_callback *, void *) = evcb->evcb_cb_union.evcb_selfcb;
			EVBASE_RELEASE_LOCK(base, th_base_lock);
			evcb_selfcb(evcb, evcb->evcb_arg);
		}
		break;
		case EV_CLOSURE_EVENT_FINALIZE:
		case EV_CLOSURE_EVENT_FINALIZE_FREE: {
			void (*evcb_evfinalize)(struct event *, void *);
			int evcb_closure = evcb->evcb_closure;
			EVUTIL_ASSERT(ev != NULL);
			base->current_event = NULL;
			evcb_evfinalize = ev->ev_evcallback.evcb_cb_union.evcb_evfinalize;
			EVUTIL_ASSERT((evcb->evcb_flags & EVLIST_FINALIZING));
			EVBASE_RELEASE_LOCK(base, th_base_lock);
			evcb_evfinalize(ev, ev->ev_arg);
			event_debug_note_teardown_(ev);
			if (evcb_closure == EV_CLOSURE_EVENT_FINALIZE_FREE)
				mm_free(ev);
		}
		break;
		case EV_CLOSURE_CB_FINALIZE: {
			void (*evcb_cbfinalize)(struct event_callback *, void *) = evcb->evcb_cb_union.evcb_cbfinalize;
			base->current_event = NULL;
			EVUTIL_ASSERT((evcb->evcb_flags & EVLIST_FINALIZING));
			EVBASE_RELEASE_LOCK(base, th_base_lock);
			evcb_cbfinalize(evcb, evcb->evcb_arg);
		}
		break;
		default:
			EVUTIL_ASSERT(0);
		}

		EVBASE_ACQUIRE_LOCK(base, th_base_lock);
		base->current_event = NULL;
#ifndef EVENT__DISABLE_THREAD_SUPPORT
		if (base->current_event_waiters) {
			base->current_event_waiters = 0;
			EVTHREAD_COND_BROADCAST(base->current_event_cond);
		}
#endif

		if (base->event_break)
			return -1;
		if (count >= max_to_process)
			return count;
		if (count && endtime) {
			struct timeval now;
			update_time_cache(base);
			gettime(base, &now);
			if (evutil_timercmp(&now, endtime, >=))
				return count;
		}
		if (base->event_continue)
			break;
	}
	return count;
}